

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O1

void __thiscall
helics::apps::PhasorGenerator::set(PhasorGenerator *this,string_view parameter,double val)

{
  long lVar1;
  int iVar2;
  char *__s1;
  size_t __n;
  size_type __rlen;
  double __x;
  double dVar3;
  double local_30;
  double local_28;
  
  __s1 = parameter._M_str;
  __n = parameter._M_len;
  lVar1 = __n - 1;
  switch(lVar1) {
  case 0:
switchD_002b14bb_caseD_0:
    iVar2 = bcmp(__s1,"f",__n);
    if (iVar2 == 0) goto LAB_002b1719;
    switch(lVar1) {
    case 0:
      goto switchD_002b158b_caseD_0;
    default:
      goto switchD_002b14bb_caseD_1;
    case 2:
      break;
    case 3:
      goto switchD_002b158b_caseD_3;
    case 5:
      goto switchD_002b14bb_caseD_5;
    case 8:
      goto switchD_002b1523_caseD_8;
    }
  default:
    goto switchD_002b14bb_caseD_1;
  case 2:
    break;
  case 3:
switchD_002b14bb_caseD_3:
    iVar2 = bcmp(__s1,"freq",__n);
    if (iVar2 == 0) goto LAB_002b1719;
    switch(lVar1) {
    case 0:
      goto switchD_002b14bb_caseD_0;
    default:
      goto switchD_002b14bb_caseD_1;
    case 2:
      break;
    case 3:
      goto switchD_002b158b_caseD_3;
    case 5:
      goto switchD_002b14bb_caseD_5;
    case 8:
      goto switchD_002b1523_caseD_8;
    }
  case 5:
switchD_002b14bb_caseD_5:
    iVar2 = bcmp(__s1,"period",__n);
    if (iVar2 == 0) {
      val = 1.0 / val;
LAB_002b1719:
      this->frequency = val;
      return;
    }
    switch(lVar1) {
    case 0:
      goto switchD_002b158b_caseD_0;
    default:
      goto switchD_002b14bb_caseD_1;
    case 2:
      break;
    case 3:
switchD_002b158b_caseD_3:
      iVar2 = bcmp(__s1,"dfdt",__n);
      if (iVar2 == 0) {
        this->dfdt = val;
        return;
      }
      switch(lVar1) {
      case 0:
        goto switchD_002b158b_caseD_0;
      default:
        goto switchD_002b14bb_caseD_1;
      case 2:
        break;
      case 3:
        iVar2 = bcmp(__s1,"dadt",__n);
        if (iVar2 == 0) {
          this->dAdt = val;
          return;
        }
        switch(lVar1) {
        case 0:
          goto switchD_002b158b_caseD_0;
        default:
          goto switchD_002b14bb_caseD_1;
        case 2:
          break;
        case 5:
          goto switchD_002b158b_caseD_5;
        case 8:
          goto switchD_002b1523_caseD_8;
        }
      case 5:
        goto switchD_002b158b_caseD_5;
      case 8:
        goto switchD_002b1523_caseD_8;
      }
    case 5:
      goto switchD_002b158b_caseD_5;
    case 8:
switchD_002b1523_caseD_8:
      iVar2 = bcmp(__s1,"amplitude",__n);
      if (iVar2 != 0) {
        switch(lVar1) {
        case 0:
          goto switchD_002b158b_caseD_0;
        default:
          goto switchD_002b14bb_caseD_1;
        case 2:
          goto switchD_002b14bb_caseD_2;
        case 5:
          goto switchD_002b158b_caseD_5;
        case 8:
          goto switchD_002b1627_caseD_8;
        }
      }
      goto LAB_002b1700;
    }
  case 8:
    iVar2 = bcmp(__s1,"frequency",__n);
    if (iVar2 == 0) goto LAB_002b1719;
    switch(lVar1) {
    case 0:
      goto switchD_002b14bb_caseD_0;
    default:
      goto switchD_002b14bb_caseD_1;
    case 2:
      break;
    case 3:
      goto switchD_002b14bb_caseD_3;
    case 5:
      goto switchD_002b14bb_caseD_5;
    case 8:
      goto switchD_002b1523_caseD_8;
    }
  }
switchD_002b14bb_caseD_2:
  iVar2 = bcmp(__s1,"amp",__n);
  if (iVar2 == 0) {
LAB_002b1700:
    this->amplitude = val;
  }
  else {
    if (__n == 9) {
switchD_002b1627_caseD_8:
      iVar2 = bcmp(__s1,"bias_real",__n);
      if (iVar2 == 0) {
        this->bias_real = val;
        return;
      }
      if (__n != 6) {
        if ((__n == 9) && (iVar2 = bcmp(__s1,"bias_imag",9), iVar2 == 0)) {
          this->bias_imag = val;
          return;
        }
        goto switchD_002b14bb_caseD_1;
      }
    }
    else if (__n != 6) {
      if (__n != 1) goto switchD_002b14bb_caseD_1;
switchD_002b158b_caseD_0:
      iVar2 = bcmp(__s1,"a",__n);
      if (iVar2 == 0) goto LAB_002b1700;
      if (__n != 6) {
        if (__n != 9) goto switchD_002b14bb_caseD_1;
        goto switchD_002b1627_caseD_8;
      }
    }
switchD_002b158b_caseD_5:
    iVar2 = bcmp(__s1,"offset",__n);
    if (iVar2 != 0) {
switchD_002b14bb_caseD_1:
      SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
      return;
    }
    __x = val - this->offset;
    dVar3 = cos(__x);
    local_28 = sin(__x);
    local_30 = dVar3;
    std::complex<double>::operator*=(&this->state,(complex<double> *)&local_30);
    this->offset = val;
  }
  return;
}

Assistant:

void PhasorGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "bias_real") {
            bias_real = val;
        } else if (parameter == "bias_imag") {
            bias_imag = val;
        } else if (parameter == "offset") {
            state *= std::polar(1.0, (val - offset));
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }